

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_append_unicode
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t sVar2;
  long lVar3;
  code *local_78;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  wchar_t tm;
  wchar_t ts;
  wchar_t ret;
  wchar_t n;
  size_t w;
  long lStack_48;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_p_local;
  archive_string *as_local;
  
  tm = L'\0';
  if ((sc->flag & 0x400U) == 0) {
    if ((sc->flag & 0x1000U) == 0) {
      if ((sc->flag & 0x100U) == 0) {
        if ((sc->flag & 0x800U) == 0) {
          if ((sc->flag & 0x2000U) == 0) {
            local_78 = unicode_to_utf8;
            parse._4_4_ = 1;
          }
          else {
            local_78 = unicode_to_utf16le;
            parse._4_4_ = 2;
          }
        }
        else {
          local_78 = unicode_to_utf16be;
          parse._4_4_ = 2;
        }
      }
      else {
        local_78 = unicode_to_utf8;
        parse._4_4_ = 1;
      }
    }
    else {
      local_78 = unicode_to_utf16le;
      parse._4_4_ = 2;
    }
  }
  else {
    local_78 = unicode_to_utf16be;
    parse._4_4_ = 2;
  }
  if ((sc->flag & 0x800U) == 0) {
    if ((sc->flag & 0x2000U) == 0) {
      unparse = cesu8_to_unicode;
      parse._0_4_ = parse._4_4_;
    }
    else {
      unparse = utf16le_to_unicode;
      parse._0_4_ = 1;
    }
  }
  else {
    unparse = utf16be_to_unicode;
    parse._0_4_ = 1;
  }
  s = (char *)sc;
  sc_local = (archive_string_conv *)len;
  len_local = (size_t)_p;
  _p_local = as;
  paVar1 = archive_string_ensure(as,as->length + len * (long)(int)parse + (long)parse._4_4_);
  if (paVar1 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    p = (char *)len_local;
    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
    lStack_48 = (*_p_local + *(long *)((long)_p_local + 0x10)) - (long)parse._4_4_;
    while( true ) {
      sVar2 = (*unparse)((char *)((long)&w + 4),(size_t)p,(uint32_t)sc_local);
      ts = (wchar_t)sVar2;
      if (ts == L'\0') break;
      if (ts < L'\0') {
        ts = -ts;
        tm = L'\xffffffff';
      }
      p = p + ts;
      sc_local = (archive_string_conv *)((long)sc_local - (long)ts);
      while (lVar3 = (*local_78)(endp,lStack_48 - (long)endp,w._4_4_), lVar3 == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar1 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)(int)parse +
                            (long)parse._4_4_);
        if (paVar1 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        lStack_48 = (*_p_local + *(long *)((long)_p_local + 0x10)) - (long)parse._4_4_;
      }
      endp = endp + lVar3;
    }
    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    if (parse._4_4_ == 2) {
      *(undefined1 *)(*_p_local + 1 + *(long *)((long)_p_local + 8)) = 0;
    }
    as_local._4_4_ = tm;
  }
  return as_local._4_4_;
}

Assistant:

static int
archive_string_append_unicode(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	uint32_t uc;
	size_t w;
	int n, ret = 0, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		ts = 1;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
			ts = 1;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		if (n < 0) {
			/* Use a replaced unicode character. */
			n *= -1;
			ret = -1;
		}
		s += n;
		len -= n;
		while ((w = unparse(p, endp - p, uc)) == 0) {
			/* There is not enough output buffer so
			 * we have to expand it. */
			as->length = p - as->s;
			if (archive_string_ensure(as,
			    as->buffer_length + len * tm + ts) == NULL)
				return (-1);
			p = as->s + as->length;
			endp = as->s + as->buffer_length - ts;
		}
		p += w;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}